

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall Clasp::DefaultMinimize::relaxBound(DefaultMinimize *this,bool full)

{
  bool bVar1;
  wsum_t *pwVar2;
  byte in_SIL;
  DefaultMinimize *in_RDI;
  long *in_stack_ffffffffffffffc8;
  SharedMinimizeData *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  uint32 n;
  
  n = (uint32)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  bVar1 = active((DefaultMinimize *)in_stack_ffffffffffffffd0);
  if (bVar1) {
    in_stack_ffffffffffffffd0 = (SharedMinimizeData *)opt(in_RDI);
    pwVar2 = opt(in_RDI);
    n = (uint32)((ulong)(pwVar2 + in_RDI->size_) >> 0x20);
    SharedMinimizeData::maxBound();
    std::fill<long*,long>
              ((long *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(long *)0x1af582);
  }
  in_RDI->pos_ = (Iter)((in_RDI->super_MinimizeConstraint).shared_ + 1);
  in_RDI->actLev_ = 0;
  if (((in_SIL & 1) != 0) ||
     (bVar1 = SharedMinimizeData::optimize(in_stack_ffffffffffffffd0), !bVar1)) {
    stepInit(in_RDI,n);
  }
  return true;
}

Assistant:

bool DefaultMinimize::relaxBound(bool full) {
	if (active()) { std::fill(opt(), opt()+size_, SharedData::maxBound()); }
	pos_       = shared_->lits;
	actLev_    = 0;
	if (full || !shared_->optimize()) { stepInit(0); }
	return true;
}